

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

DebugScope __thiscall
spvtools::opt::analysis::DebugInfoManager::BuildDebugScope
          (DebugInfoManager *this,DebugScope *callee_instr_scope,
          DebugInlinedAtContext *inlined_at_ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  DebugScope DVar3;
  
  uVar1 = callee_instr_scope->lexical_scope_;
  uVar2 = BuildDebugInlinedAtChain(this,callee_instr_scope->inlined_at_,inlined_at_ctx);
  DVar3.inlined_at_ = uVar2;
  DVar3.lexical_scope_ = uVar1;
  return DVar3;
}

Assistant:

uint32_t AddNewConstInGlobals(IRContext* context, uint32_t const_value) {
  uint32_t id = context->TakeNextId();
  std::unique_ptr<Instruction> new_const(new Instruction(
      context, spv::Op::OpConstant, context->get_type_mgr()->GetUIntTypeId(),
      id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
           {const_value}},
      }));
  context->module()->AddGlobalValue(std::move(new_const));
  context->InvalidateAnalyses(IRContext::kAnalysisConstants);
  context->InvalidateAnalyses(IRContext::kAnalysisDefUse);
  return id;
}